

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

uint32_t findTaggedAliasListsOffset(char *alias,char *standard,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint32_t uVar6;
  UErrorCode UVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint32_t uVar17;
  ulong uVar18;
  char *dst;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  char strippedName [60];
  char local_78 [72];
  
  uVar6 = getTagNumber(standard);
  uVar1 = (gMainTable.optionTable)->stringNormalizationType;
  dst = alias;
  if (uVar1 != 0) {
    sVar10 = strlen(alias);
    if (0x3b < sVar10) {
      UVar7 = U_BUFFER_OVERFLOW_ERROR;
      uVar13 = 0xffffffff;
      bVar20 = false;
LAB_001646a6:
      *pErrorCode = UVar7;
      goto LAB_001646a9;
    }
    dst = local_78;
    ucnv_io_stripASCIIForCompare_63(dst,alias);
  }
  puVar5 = gMainTable.normalizedStringTable;
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.aliasList;
  uVar13 = 0;
  uVar17 = gMainTable.untaggedConvArraySize;
  uVar14 = gMainTable.untaggedConvArraySize >> 1;
  do {
    if (uVar1 == 0) {
      iVar15 = ucnv_compareNames_63(dst,(char *)(puVar4 + puVar3[uVar14]));
    }
    else {
      iVar15 = strcmp(dst,(char *)(puVar5 + puVar3[uVar14]));
    }
    uVar8 = uVar14;
    if ((-1 < iVar15) && (uVar8 = uVar17, uVar13 = uVar14, iVar15 == 0)) {
      uVar13 = gMainTable.untaggedConvArray[uVar14] & 0xfff;
      if (-1 < (short)gMainTable.untaggedConvArray[uVar14]) goto LAB_00164684;
      UVar7 = U_AMBIGUOUS_ALIAS_WARNING;
      bVar20 = true;
      goto LAB_001646a6;
    }
    uVar17 = uVar8;
    uVar8 = uVar17 + uVar13 >> 1;
    bVar20 = uVar14 != uVar8;
    uVar14 = uVar8;
  } while (bVar20);
  uVar13 = 0xffffffff;
LAB_00164684:
  bVar20 = false;
LAB_001646a9:
  uVar17 = gMainTable.converterListSize;
  puVar5 = gMainTable.stringTable;
  puVar4 = gMainTable.taggedAliasLists;
  puVar3 = gMainTable.taggedAliasArray;
  if (gMainTable.tagListSize - 1 <= uVar6) {
    return 0xffffffff;
  }
  if (gMainTable.converterListSize <= uVar13) {
    return 0xffffffff;
  }
  iVar15 = uVar6 * gMainTable.converterListSize;
  uVar2 = gMainTable.taggedAliasArray[uVar13 + iVar15];
  if ((ulong)uVar2 == 0) {
    if (!bVar20) {
      return 0;
    }
  }
  else {
    uVar6 = 0;
    if (gMainTable.taggedAliasLists[(ulong)uVar2 + 1] != 0) {
      uVar6 = (uint)uVar2;
    }
    if (!(bool)(gMainTable.taggedAliasLists[(ulong)uVar2 + 1] == 0 & bVar20)) {
      return uVar6;
    }
  }
  uVar12 = (ulong)gMainTable.taggedAliasArraySize;
  if (uVar12 != 0) {
    uVar18 = 0;
    do {
      uVar11 = (ulong)puVar3[uVar18];
      if ((uVar11 != 0) && (uVar16 = (ulong)puVar4[uVar11], uVar16 != 0)) {
        bVar20 = true;
        uVar19 = 1;
        do {
          if (((ulong)puVar4[uVar11 + uVar19] != 0) &&
             (iVar9 = ucnv_compareNames_63(alias,(char *)(puVar5 + puVar4[uVar11 + uVar19])),
             iVar9 == 0)) break;
          bVar20 = uVar19 < uVar16;
          bVar21 = uVar19 != uVar16;
          uVar19 = uVar19 + 1;
        } while (bVar21);
        if (bVar20) {
          uVar2 = puVar3[(uint)((int)((uVar18 & 0xffffffff) % (ulong)uVar17) + iVar15)];
          if (((ulong)uVar2 != 0) && (puVar4[(ulong)uVar2 + 1] != 0)) {
            return (uint)uVar2;
          }
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar12);
  }
  return 0;
}

Assistant:

static uint32_t
findTaggedAliasListsOffset(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    uint32_t idx;
    uint32_t listOffset;
    uint32_t convNum;
    UErrorCode myErr = U_ZERO_ERROR;
    uint32_t tagNum = getTagNumber(standard);

    /* Make a quick guess. Hopefully they used a TR22 canonical alias. */
    convNum = findConverter(alias, NULL, &myErr);
    if (myErr != U_ZERO_ERROR) {
        *pErrorCode = myErr;
    }

    if (tagNum < (gMainTable.tagListSize - UCNV_NUM_HIDDEN_TAGS) && convNum < gMainTable.converterListSize) {
        listOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + convNum];
        if (listOffset && gMainTable.taggedAliasLists[listOffset + 1]) {
            return listOffset;
        }
        if (myErr == U_AMBIGUOUS_ALIAS_WARNING) {
            /* Uh Oh! They used an ambiguous alias.
               We have to search the whole swiss cheese starting
               at the highest standard affinity.
               This may take a while.
            */
            for (idx = 0; idx < gMainTable.taggedAliasArraySize; idx++) {
                listOffset = gMainTable.taggedAliasArray[idx];
                if (listOffset && isAliasInList(alias, listOffset)) {
                    uint32_t currTagNum = idx/gMainTable.converterListSize;
                    uint32_t currConvNum = (idx - currTagNum*gMainTable.converterListSize);
                    uint32_t tempListOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + currConvNum];
                    if (tempListOffset && gMainTable.taggedAliasLists[tempListOffset + 1]) {
                        return tempListOffset;
                    }
                    /* else keep on looking */
                    /* We could speed this up by starting on the next row
                       because an alias is unique per row, right now.
                       This would change if alias versioning appears. */
                }
            }
            /* The standard doesn't know about the alias */
        }
        /* else no default name */
        return 0;
    }
    /* else converter or tag not found */

    return UINT32_MAX;
}